

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_hash_map_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_5::ParallelFlatHashMap_EraseIf_Test::~ParallelFlatHashMap_EraseIf_Test
          (ParallelFlatHashMap_EraseIf_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(THIS_TEST_NAME, EraseIf) {
    // -------------
    // test erase_if
    // -------------
    using Map = ThisMap<int, int>;
    Map m = { {1, 7}, {2, 9}, {5, 6} };

    EXPECT_EQ(m.erase_if(9, [](Map::value_type& v) { assert(0); return v.second == 12; }), false); // m[9] not present - lambda not called
    EXPECT_EQ(m.erase_if(5, [](Map::value_type& v) { return v.second == 12; }), false);            // m[5] == 6, so erase not performed
    EXPECT_EQ(m[5], 6);
    EXPECT_EQ(m.erase_if(5, [](Map::value_type& v) { return v.second == 6; }), true);              // lambda returns true, so m[5] erased
    EXPECT_EQ(m[5], 0);
}